

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

natwm_error map_insert_entry(map *map,map_entry *entry)

{
  map_settings mVar1;
  map_entry *pmVar2;
  map_entry **__src;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  bool bVar6;
  _Bool _Var7;
  natwm_error nVar8;
  size_t sVar9;
  map_entry **ppmVar10;
  void *__dest;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  double dVar17;
  undefined1 in_XMM2 [16];
  
  while( true ) {
    uVar13 = (ulong)entry->hash % (ulong)map->length;
    pmVar2 = map->entries[uVar13];
    if (((pmVar2 == (map_entry *)0x0) || (pmVar2->key == (void *)0x0)) ||
       ((int *)pmVar2->value == &EMPTY_ENTRY)) {
      (*map->key_size_function)(entry->key);
      bVar6 = false;
    }
    else {
      sVar9 = (*map->key_size_function)(entry->key);
      _Var7 = (*map->key_compare_function)(entry->key,pmVar2->key,sVar9);
      bVar6 = true;
      if (_Var7) {
        map_entry_destroy(map,pmVar2);
        map->entries[uVar13] = entry;
        return NO_ERROR;
      }
    }
    mVar1 = map->setting_flags;
    if ((mVar1 & MAP_FLAG_IGNORE_THRESHOLDS) != 0) break;
    auVar3 = vcvtusi2sd_avx512f(in_XMM2,map->bucket_count);
    uVar12 = map->length;
    auVar4 = vcvtusi2sd_avx512f(in_XMM2,uVar12);
    dVar17 = (auVar3._0_8_ + 1.0) / auVar4._0_8_;
    if (0.75 <= dVar17) {
      uVar14 = uVar12 * 2;
    }
    else {
      if (((mVar1 & MAP_FLAG_IGNORE_THRESHOLDS_EMPTY) != 0) || (0.2 < dVar17)) break;
      uVar14 = uVar12 >> 1;
    }
    ppmVar10 = (map_entry **)calloc((ulong)uVar14,8);
    if (ppmVar10 == (map_entry **)0x0) {
      return MEMORY_ALLOCATION_ERROR;
    }
    if ((mVar1 & MAP_FLAG_NO_LOCKING) == 0) {
      pthread_mutex_lock((pthread_mutex_t *)&map->mutex);
      uVar12 = map->length;
    }
    *(undefined1 *)&map->event_flags = (char)map->event_flags | EVENT_FLAG_RESIZING_MAP;
    uVar13 = (ulong)uVar12;
    __dest = malloc(uVar13 * 8);
    if (__dest == (void *)0x0) {
      free(ppmVar10);
      return MEMORY_ALLOCATION_ERROR;
    }
    __src = map->entries;
    memcpy(__dest,__src,uVar13 * 8);
    free(__src);
    map->length = uVar14;
    map->bucket_count = 0;
    map->entries = ppmVar10;
    if (uVar13 != 0) {
      uVar16 = 0;
      do {
        pmVar2 = *(map_entry **)((long)__dest + uVar16 * 8);
        if ((((pmVar2 != (map_entry *)0x0) && (pmVar2->key != (void *)0x0)) &&
            ((int *)pmVar2->value != &EMPTY_ENTRY)) &&
           (nVar8 = map_insert_entry(map,pmVar2), nVar8 != NO_ERROR)) {
          return nVar8;
        }
        uVar16 = uVar16 + 1;
      } while (uVar13 != uVar16);
    }
    free(__dest);
    *(undefined1 *)&map->event_flags = (char)map->event_flags & 0xfd;
    if ((map->setting_flags & MAP_FLAG_NO_LOCKING) == 0) {
      pthread_mutex_unlock((pthread_mutex_t *)&map->mutex);
    }
  }
  if (bVar6) {
    uVar12 = map->length;
    if (uVar12 < map->bucket_count + 1) {
      map_entry_destroy(map,entry);
      return CAPACITY_ERROR;
    }
    if (uVar12 == 0) {
      return CAPACITY_ERROR;
    }
    uVar16 = 0;
    while( true ) {
      if (uVar12 <= (uint)uVar13) {
        uVar13 = 0;
      }
      ppmVar10 = map->entries;
      pmVar2 = ppmVar10[uVar13];
      if (((pmVar2 == (map_entry *)0x0) || (pmVar2->key == (void *)0x0)) ||
         ((int *)pmVar2->value == &EMPTY_ENTRY)) break;
      uVar14 = entry->hash % uVar12;
      uVar15 = (uint)uVar13;
      uVar5 = uVar15 - uVar14;
      if (uVar15 < uVar14) {
        uVar5 = uVar14 + (uVar12 - uVar15);
      }
      uVar11 = pmVar2->hash % uVar12;
      uVar14 = uVar15 - uVar11;
      if (uVar15 < uVar11) {
        uVar14 = (uVar12 - uVar15) + uVar11;
      }
      if (uVar14 < uVar5) {
        ppmVar10[uVar13] = entry;
        uVar12 = map->length;
        entry = pmVar2;
      }
      uVar13 = (ulong)(uVar15 + 1);
      uVar16 = uVar16 + 1;
      if (uVar12 <= uVar16) {
        return CAPACITY_ERROR;
      }
    }
    ppmVar10[uVar13] = entry;
  }
  else {
    ppmVar10 = map->entries;
    pmVar2 = ppmVar10[uVar13];
    if ((pmVar2 != (map_entry *)0x0) && ((int *)pmVar2->value == &EMPTY_ENTRY)) {
      map_entry_destroy(map,pmVar2);
      ppmVar10 = map->entries;
    }
    ppmVar10[uVar13] = entry;
  }
  map->bucket_count = map->bucket_count + 1;
  return NO_ERROR;
}

Assistant:

static enum natwm_error map_insert_entry(struct map *map, struct map_entry *entry)
{
        // Get the new initial idex
        uint32_t initial_index = entry->hash % map->length;
        struct map_entry *present_entry = map->entries[initial_index];
        bool is_hash_collision = is_entry_present(present_entry);
        size_t key_size = map->key_size_function(entry->key);

        // If there is a collision with the same key overwrite it
        if (is_hash_collision
            && map->key_compare_function(entry->key, present_entry->key, key_size)) {
                map_entry_destroy(map, present_entry);

                map->entries[initial_index] = entry;

                return NO_ERROR;
        }

        // Now we need to increase map->bucket_count
        int resize_direction = get_resize_direction(map, map->bucket_count + 1.0);

        if (resize_direction != 0) {
                enum natwm_error resize_error = map_resize(map, resize_direction);

                if (resize_error != NO_ERROR) {
                        return resize_error;
                }

                // Insert with the new size
                return map_insert_entry(map, entry);
        }

        if (!is_hash_collision) {
                // No collision - just insert here
                if (map->entries[initial_index] != NULL
                    && map->entries[initial_index]->value == &EMPTY_ENTRY) {
                        // We previously had a value here - delete it and
                        // replace
                        map_entry_destroy(map, map->entries[initial_index]);
                }

                map->entries[initial_index] = entry;
                map->bucket_count += 1;

                return NO_ERROR;
        }

        if ((map->bucket_count + 1) > map->length) {
                map_entry_destroy(map, entry);

                return CAPACITY_ERROR;
        }

        // Handle collision
        enum natwm_error error = map_probe(map, entry, initial_index);

        if (error != NO_ERROR) {
                return error;
        }

        map->bucket_count += 1;

        return NO_ERROR;
}